

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O2

Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *pFForm,uint uCube,int nStart,int nFinish)

{
  uint uVar1;
  Kit_Edge_t KVar2;
  Kit_Edge_t eEdge1;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint nFinish_00;
  
  if (uCube == 0) {
    __assert_fail("uCube",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                  ,0xcb,
                  "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
  }
  uVar5 = 0xffffffff;
  uVar1 = 0;
  for (uVar4 = nStart; (int)uVar4 < nFinish; uVar4 = uVar4 + 1) {
    uVar1 = uVar1 + ((uCube >> (uVar4 & 0x1f) & 1) != 0);
    if ((uCube >> (uVar4 & 0x1f) & 1) != 0) {
      uVar5 = uVar4;
    }
  }
  if (uVar5 == 0xffffffff) {
    __assert_fail("iLit != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitFactor.c"
                  ,0xd4,
                  "Kit_Edge_t Kit_SopFactorTrivialCube_rec(Kit_Graph_t *, unsigned int, int, int)");
  }
  if (uVar1 == 1) {
    return (Kit_Edge_t)((uVar5 & 1) + ((int)uVar5 / 2 & 0x3fffffffU) * 2);
  }
  uVar5 = nStart;
  if (nStart < nFinish) {
    uVar5 = nFinish;
  }
  uVar3 = 0;
  for (uVar4 = nStart; nFinish_00 = uVar5, (int)uVar4 < nFinish; uVar4 = uVar4 + 1) {
    if ((uCube >> (uVar4 & 0x1f) & 1) != 0) {
      nFinish_00 = uVar4;
      if (uVar3 == uVar1 >> 1) break;
      uVar3 = uVar3 + 1;
    }
  }
  KVar2 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,nStart,nFinish_00);
  eEdge1 = Kit_SopFactorTrivialCube_rec(pFForm,uCube,nFinish_00,nFinish);
  KVar2 = Kit_GraphAddNodeAnd(pFForm,KVar2,eEdge1);
  return KVar2;
}

Assistant:

Kit_Edge_t Kit_SopFactorTrivialCube_rec( Kit_Graph_t * pFForm, unsigned uCube, int nStart, int nFinish )
{
    Kit_Edge_t eNode1, eNode2;
    int i, iLit = -1, nLits, nLits1, nLits2;
    assert( uCube );
    // count the number of literals in this interval
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            iLit = i;
            nLits++;
        }
    assert( iLit != -1 );
    // quit if there is only one literal        
    if ( nLits == 1 )
        return Kit_EdgeCreate( iLit/2, iLit%2 ); // CST
    // split the literals into two parts
    nLits1 = nLits/2;
    nLits2 = nLits - nLits1;
//    nLits2 = nLits/2;
//    nLits1 = nLits - nLits2;
    // find the splitting point
    nLits = 0;
    for ( i = nStart; i < nFinish; i++ )
        if ( Kit_CubeHasLit(uCube, i) )
        {
            if ( nLits == nLits1 )
                break;
            nLits++;
        }
    // recursively construct the tree for the parts
    eNode1 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, nStart, i  );
    eNode2 = Kit_SopFactorTrivialCube_rec( pFForm, uCube, i, nFinish );
    return Kit_GraphAddNodeAnd( pFForm, eNode1, eNode2 );
}